

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webp_enc.c
# Opt level: O3

int DeleteVP8Encoder(VP8Encoder *enc)

{
  int iVar1;
  
  iVar1 = VP8EncDeleteAlpha(enc);
  VP8TBufferClear(&enc->tokens_);
  WebPSafeFree(enc);
  return iVar1;
}

Assistant:

static int DeleteVP8Encoder(VP8Encoder* enc) {
  int ok = 1;
  if (enc != NULL) {
    ok = VP8EncDeleteAlpha(enc);
    VP8TBufferClear(&enc->tokens_);
    WebPSafeFree(enc);
  }
  return ok;
}